

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O1

lexeme_t<cfgfile::qstring_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme
          (lexeme_t<cfgfile::qstring_trait_t> *__return_storage_ptr__,
          lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  input_stream_t<cfgfile::qstring_trait_t> *piVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  pos_t pVar4;
  bool bVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char cVar9;
  bool bVar10;
  char_t cVar11;
  logic_error *plVar12;
  int iVar13;
  bool bVar14;
  char_t new_char;
  string_t result;
  char_t local_24a;
  string local_248;
  QArrayData *local_228;
  char16_t *pcStack_220;
  qsizetype local_218;
  lexeme_t<cfgfile::qstring_trait_t> *local_208;
  string local_200;
  string_t local_1e0;
  string_t local_1c8;
  QString local_1b0;
  string_t local_198;
  qstring_wrapper_t local_180;
  qstring_wrapper_t local_168;
  qstring_wrapper_t local_150;
  qstring_wrapper_t local_138;
  qstring_wrapper_t local_120;
  string local_108;
  string local_e8;
  qstring_wrapper_t local_c8;
  qstring_wrapper_t local_a8;
  qstring_wrapper_t local_88;
  string_t *local_68;
  string_t local_60;
  string_t local_48;
  
  local_228 = (QArrayData *)0x0;
  pcStack_220 = (char16_t *)0x0;
  local_218 = 0;
  skip_spaces(this);
  piVar1 = this->m_stream;
  pVar4 = piVar1->m_column_number;
  this->m_line_number = piVar1->m_line_number;
  this->m_column_number = pVar4;
  if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) && (cVar9 = QTextStream::atEnd(), cVar9 != '\0')) &&
     (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) {
    __return_storage_ptr__->m_type = null;
    (__return_storage_ptr__->m_value).m_str.d.d = (Data *)0x0;
    (__return_storage_ptr__->m_value).m_str.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->m_value).m_str.d.size = 0;
  }
  else {
    local_68 = &__return_storage_ptr__->m_value;
    bVar6 = true;
    bVar14 = false;
    bVar5 = false;
    local_208 = __return_storage_ptr__;
    do {
      cVar11 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
      if (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_quotes) {
        iVar13 = 3;
        if (bVar5) goto LAB_0014197f;
        if (!bVar6) {
LAB_0014184b:
          iVar13 = 3;
          input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,cVar11);
          goto LAB_0014197f;
        }
        bVar5 = true;
LAB_001418fb:
        piVar1 = this->m_stream;
        if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) &&
            (cVar9 = QTextStream::atEnd(), cVar9 != '\0')) &&
           (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) {
          if (bVar5) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x28);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_248,"Unfinished quoted lexeme. ","");
            qstring_trait_t::from_ascii(&local_180,&local_248);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"End of file riched. In file \"","");
            qstring_trait_t::from_ascii(&local_198,&local_e8);
            operator+(&local_168,&local_180,&local_198);
            operator+(&local_150,&local_168,&this->m_stream->m_file_name);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"\" on line ","");
            qstring_trait_t::from_ascii((string_t *)&local_1b0,&local_108);
            operator+(&local_138,&local_150,(qstring_wrapper_t *)&local_1b0);
            qstring_trait_t::to_string(&local_1c8,this->m_line_number);
            operator+(&local_120,&local_138,&local_1c8);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,".","");
            qstring_trait_t::from_ascii(&local_1e0,&local_200);
            operator+(&local_c8,&local_120,&local_1e0);
            std::logic_error::logic_error(plVar12,"Please use desc() method of the exception.");
            *(undefined ***)plVar12 = &PTR__exception_t_00164c00;
            *(undefined8 *)(plVar12 + 0x10) = 0;
            *(undefined8 *)(plVar12 + 0x18) = 0;
            *(undefined8 *)(plVar12 + 0x20) = 0;
            pcVar2 = *(char16_t **)(plVar12 + 0x18);
            uVar7 = local_c8.m_str.d.d._0_4_;
            uVar8 = local_c8.m_str.d.d._4_4_;
            local_c8.m_str.d.d = (Data *)0x0;
            *(undefined4 *)(plVar12 + 0x10) = uVar7;
            *(undefined4 *)(plVar12 + 0x14) = uVar8;
            *(undefined4 *)(plVar12 + 0x18) = local_c8.m_str.d.ptr._0_4_;
            *(undefined4 *)(plVar12 + 0x1c) = local_c8.m_str.d.ptr._4_4_;
            qVar3 = *(qsizetype *)(plVar12 + 0x20);
            *(qsizetype *)(plVar12 + 0x20) = local_c8.m_str.d.size;
            local_c8.m_str.d.ptr = pcVar2;
            local_c8.m_str.d.size = qVar3;
            __cxa_throw(plVar12,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          iVar13 = 3;
          if (local_218 == 0) {
            local_208->m_type = null;
            (local_68->m_str).d.d = (Data *)0x0;
            (local_68->m_str).d.ptr = (char16_t *)0x0;
            (local_68->m_str).d.size = 0;
LAB_001419ef:
            iVar13 = 1;
          }
        }
        else {
          iVar13 = 0;
          if (bVar14) {
            bVar14 = false;
            iVar13 = 0;
          }
          else {
            bVar6 = false;
          }
        }
      }
      else {
        if (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_back_slash) {
          local_24a.ucs = L'\0';
          if ((bVar5) && (bVar10 = process_back_slash(this,&local_24a), !bVar10)) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x28);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_248,"Unrecognized back-slash sequence: \"\\","");
            qstring_trait_t::from_ascii(&local_198,&local_248);
            QString::QString(&local_1b0,1,(QChar)local_24a.ucs);
            operator+(&local_180,&local_198,(qstring_wrapper_t *)&local_1b0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"\". In file \"","")
            ;
            qstring_trait_t::from_ascii(&local_1c8,&local_e8);
            operator+(&local_168,&local_180,&local_1c8);
            operator+(&local_150,&local_168,&this->m_stream->m_file_name);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"\" on line ","");
            qstring_trait_t::from_ascii(&local_1e0,&local_108);
            operator+(&local_138,&local_150,&local_1e0);
            qstring_trait_t::to_string(&local_48,this->m_line_number);
            operator+(&local_120,&local_138,&local_48);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,".","");
            qstring_trait_t::from_ascii(&local_60,&local_200);
            operator+(&local_88,&local_120,&local_60);
            std::logic_error::logic_error(plVar12,"Please use desc() method of the exception.");
            *(undefined ***)plVar12 = &PTR__exception_t_00164c00;
            *(undefined8 *)(plVar12 + 0x10) = 0;
            *(undefined8 *)(plVar12 + 0x18) = 0;
            *(undefined8 *)(plVar12 + 0x20) = 0;
            pcVar2 = *(char16_t **)(plVar12 + 0x18);
            uVar7 = local_88.m_str.d.d._0_4_;
            uVar8 = local_88.m_str.d.d._4_4_;
            local_88.m_str.d.d = (Data *)0x0;
            *(undefined4 *)(plVar12 + 0x10) = uVar7;
            *(undefined4 *)(plVar12 + 0x14) = uVar8;
            *(undefined4 *)(plVar12 + 0x18) = local_88.m_str.d.ptr._0_4_;
            *(undefined4 *)(plVar12 + 0x1c) = local_88.m_str.d.ptr._4_4_;
            qVar3 = *(qsizetype *)(plVar12 + 0x20);
            *(qsizetype *)(plVar12 + 0x20) = local_88.m_str.d.size;
            local_88.m_str.d.ptr = pcVar2;
            local_88.m_str.d.size = qVar3;
            __cxa_throw(plVar12,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          QString::append((QChar)(char16_t)&local_228);
          goto LAB_001418fb;
        }
        if (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_begin_tag) {
          if (local_218 == 0) {
            QString::QString((QString *)&local_248,1,(QChar)cVar11.ucs);
            local_208->m_type = start;
            goto LAB_001419a9;
          }
LAB_00141841:
          if (!bVar5) goto LAB_0014184b;
LAB_001418ef:
          QString::append((QChar)(char16_t)&local_228);
          goto LAB_001418fb;
        }
        if (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_end_tag) {
          if (local_218 != 0) goto LAB_00141841;
          QString::QString((QString *)&local_248,1,(QChar)cVar11.ucs);
          local_208->m_type = finish;
LAB_001419a9:
          (local_208->m_value).m_str.d.d = (Data *)local_248._M_dataplus._M_p;
          (local_208->m_value).m_str.d.ptr = (char16_t *)local_248._M_string_length;
          (local_208->m_value).m_str.d.size = local_248.field_2._M_allocated_capacity;
          if ((QArrayData *)local_248._M_dataplus._M_p != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_248._M_dataplus._M_p = *(int *)local_248._M_dataplus._M_p + 1;
            UNLOCK();
            LOCK();
            *(int *)local_248._M_dataplus._M_p = *(int *)local_248._M_dataplus._M_p + -1;
            UNLOCK();
            if (*(int *)local_248._M_dataplus._M_p == 0) {
              QArrayData::deallocate((QArrayData *)local_248._M_dataplus._M_p,2,8);
            }
          }
          goto LAB_001419ef;
        }
        if ((cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_space) ||
           (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_tab)) {
          iVar13 = 3;
          if (bVar5) goto LAB_001418ef;
        }
        else if ((cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_carriage_return) ||
                (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_line_feed)) {
          iVar13 = 3;
          if (bVar5) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x28);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_248,"Unfinished quoted lexeme. ","");
            qstring_trait_t::from_ascii(&local_180,&local_248);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"New line detected. In file \"","");
            qstring_trait_t::from_ascii(&local_198,&local_e8);
            operator+(&local_168,&local_180,&local_198);
            operator+(&local_150,&local_168,&this->m_stream->m_file_name);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"\" on line ","");
            qstring_trait_t::from_ascii((string_t *)&local_1b0,&local_108);
            operator+(&local_138,&local_150,(qstring_wrapper_t *)&local_1b0);
            qstring_trait_t::to_string(&local_1c8,this->m_line_number);
            operator+(&local_120,&local_138,&local_1c8);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,".","");
            qstring_trait_t::from_ascii(&local_1e0,&local_200);
            operator+(&local_a8,&local_120,&local_1e0);
            std::logic_error::logic_error(plVar12,"Please use desc() method of the exception.");
            *(undefined ***)plVar12 = &PTR__exception_t_00164c00;
            *(undefined8 *)(plVar12 + 0x10) = 0;
            *(undefined8 *)(plVar12 + 0x18) = 0;
            *(undefined8 *)(plVar12 + 0x20) = 0;
            pcVar2 = *(char16_t **)(plVar12 + 0x18);
            uVar7 = local_a8.m_str.d.d._0_4_;
            uVar8 = local_a8.m_str.d.d._4_4_;
            local_a8.m_str.d.d = (Data *)0x0;
            *(undefined4 *)(plVar12 + 0x10) = uVar7;
            *(undefined4 *)(plVar12 + 0x14) = uVar8;
            *(undefined4 *)(plVar12 + 0x18) = local_a8.m_str.d.ptr._0_4_;
            *(undefined4 *)(plVar12 + 0x1c) = local_a8.m_str.d.ptr._4_4_;
            qVar3 = *(qsizetype *)(plVar12 + 0x20);
            *(qsizetype *)(plVar12 + 0x20) = local_a8.m_str.d.size;
            local_a8.m_str.d.ptr = pcVar2;
            local_a8.m_str.d.size = qVar3;
            __cxa_throw(plVar12,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
        }
        else {
          if (((cVar11.ucs != const_t<cfgfile::qstring_trait_t>::c_vertical_bar) || (bVar5)) ||
             (bVar10 = input_stream_t<cfgfile::qstring_trait_t>::at_end(this->m_stream), bVar10))
          goto LAB_001418ef;
          cVar11 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
          if (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_vertical_bar) {
            skip_one_line_comment(this);
LAB_00141a21:
            if (bVar6) {
              skip_spaces(this);
              bVar10 = true;
              iVar13 = 0;
              bVar14 = true;
            }
            else {
              bVar14 = true;
              iVar13 = 3;
              bVar10 = false;
            }
          }
          else {
            if (cVar11.ucs == const_t<cfgfile::qstring_trait_t>::c_sharp) {
              skip_multi_line_comment(this);
              goto LAB_00141a21;
            }
            QString::append((QChar)(char16_t)&local_228);
            input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,cVar11);
            iVar13 = 0;
            bVar10 = true;
          }
          if (bVar10) goto LAB_001418fb;
        }
      }
LAB_0014197f:
    } while (iVar13 == 0);
    __return_storage_ptr__ = local_208;
    if (iVar13 == 3) {
      local_208->m_type = string;
      (local_208->m_value).m_str.d.d = (Data *)local_228;
      (local_208->m_value).m_str.d.ptr = pcStack_220;
      (local_208->m_value).m_str.d.size = local_218;
      if (local_228 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_228->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_228->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
  }
  if (local_228 != (QArrayData *)0x0) {
    LOCK();
    (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_228,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}